

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::
     general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<double,_long,_1> *alhs,
          const_blas_data_mapper<double,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double *pdVar6;
  long lVar7;
  double *pdVar8;
  long lVar9;
  double *pdVar10;
  double *pdVar11;
  long lVar12;
  double *pdVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double *local_f0;
  double *local_e8;
  double *local_e0;
  double *local_a0;
  double *local_98;
  
  pdVar13 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
  if (rows < 8 || 32000 < (ulong)(lVar2 * 8)) {
    uVar14 = 0;
  }
  else {
    pdVar10 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    local_e0 = pdVar13 + lVar2 * 7;
    pdVar8 = pdVar13 + lVar2 * 3;
    pdVar11 = pdVar13 + lVar2 * 6;
    local_e8 = pdVar13 + lVar2 * 5;
    local_f0 = pdVar13 + lVar2 * 4;
    local_98 = pdVar13 + lVar2 * 2;
    local_a0 = pdVar13 + lVar2;
    uVar14 = 0;
    pdVar6 = pdVar13;
    do {
      if (cols < 2) {
        dVar23 = 0.0;
        dVar24 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar19 = 0.0;
        dVar20 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar21 = 0.0;
        dVar22 = 0.0;
        lVar12 = 0;
      }
      else {
        dVar21 = 0.0;
        dVar22 = 0.0;
        dVar29 = 0.0;
        dVar30 = 0.0;
        dVar19 = 0.0;
        dVar20 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar25 = 0.0;
        dVar26 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar23 = 0.0;
        dVar24 = 0.0;
        lVar9 = 0;
        do {
          pdVar3 = pdVar10 + lVar9;
          dVar4 = *pdVar3;
          dVar5 = pdVar3[1];
          dVar21 = dVar21 + pdVar6[lVar9] * dVar4;
          dVar22 = dVar22 + (pdVar6 + lVar9)[1] * dVar5;
          dVar29 = dVar29 + pdVar6[lVar9 + lVar2] * dVar4;
          dVar30 = dVar30 + (pdVar6 + lVar9 + lVar2)[1] * dVar5;
          dVar19 = dVar19 + pdVar6[lVar9 + lVar2 * 2] * dVar4;
          dVar20 = dVar20 + (pdVar6 + lVar9 + lVar2 * 2)[1] * dVar5;
          dVar27 = dVar27 + pdVar6[lVar9 + lVar2 * 3] * dVar4;
          dVar28 = dVar28 + (pdVar6 + lVar9 + lVar2 * 3)[1] * dVar5;
          dVar17 = dVar17 + pdVar6[lVar9 + lVar2 * 4] * dVar4;
          dVar18 = dVar18 + (pdVar6 + lVar9 + lVar2 * 4)[1] * dVar5;
          dVar25 = dVar25 + pdVar6[lVar9 + lVar2 * 5] * dVar4;
          dVar26 = dVar26 + (pdVar6 + lVar9 + lVar2 * 5)[1] * dVar5;
          dVar15 = dVar15 + pdVar6[lVar9 + lVar2 * 6] * dVar4;
          dVar16 = dVar16 + (pdVar6 + lVar9 + lVar2 * 6)[1] * dVar5;
          dVar23 = dVar23 + pdVar6[lVar9 + lVar2 * 7] * dVar4;
          dVar24 = dVar24 + (pdVar6 + lVar9 + lVar2 * 7)[1] * dVar5;
          lVar12 = lVar9 + 2;
          lVar7 = lVar9 + 4;
          lVar9 = lVar12;
        } while (lVar7 <= cols);
      }
      dVar22 = dVar22 + dVar21;
      dVar30 = dVar30 + dVar29;
      dVar20 = dVar20 + dVar19;
      dVar28 = dVar28 + dVar27;
      dVar18 = dVar18 + dVar17;
      dVar26 = dVar26 + dVar25;
      dVar16 = dVar16 + dVar15;
      dVar24 = dVar24 + dVar23;
      if (lVar12 < cols) {
        lVar9 = 0;
        do {
          dVar15 = pdVar10[lVar12 + lVar9];
          dVar22 = dVar22 + pdVar6[lVar12 + lVar9] * dVar15;
          dVar30 = dVar30 + local_a0[lVar12 + lVar9] * dVar15;
          dVar20 = dVar20 + local_98[lVar12 + lVar9] * dVar15;
          dVar28 = dVar28 + pdVar8[lVar12 + lVar9] * dVar15;
          dVar18 = dVar18 + local_f0[lVar12 + lVar9] * dVar15;
          dVar26 = dVar26 + local_e8[lVar12 + lVar9] * dVar15;
          dVar16 = dVar16 + pdVar11[lVar12 + lVar9] * dVar15;
          dVar24 = dVar24 + local_e0[lVar12 + lVar9] * dVar15;
          lVar9 = lVar9 + 1;
        } while (cols - lVar12 != lVar9);
      }
      res[uVar14 * resIncr] = alpha * dVar22 + res[uVar14 * resIncr];
      lVar9 = (uVar14 | 1) * resIncr;
      res[lVar9] = dVar30 * alpha + res[lVar9];
      lVar9 = (uVar14 | 2) * resIncr;
      res[lVar9] = alpha * dVar20 + res[lVar9];
      lVar9 = (uVar14 | 3) * resIncr;
      res[lVar9] = dVar28 * alpha + res[lVar9];
      lVar9 = (uVar14 | 4) * resIncr;
      res[lVar9] = alpha * dVar18 + res[lVar9];
      lVar9 = (uVar14 | 5) * resIncr;
      res[lVar9] = dVar26 * alpha + res[lVar9];
      lVar9 = (uVar14 | 6) * resIncr;
      res[lVar9] = alpha * dVar16 + res[lVar9];
      lVar9 = (uVar14 | 7) * resIncr;
      res[lVar9] = dVar24 * alpha + res[lVar9];
      uVar14 = uVar14 + 8;
      pdVar6 = pdVar6 + lVar2 * 8;
      local_e0 = local_e0 + lVar2 * 8;
      pdVar11 = pdVar11 + lVar2 * 8;
      local_e8 = local_e8 + lVar2 * 8;
      local_f0 = local_f0 + lVar2 * 8;
      pdVar8 = pdVar8 + lVar2 * 8;
      local_98 = local_98 + lVar2 * 8;
      local_a0 = local_a0 + lVar2 * 8;
    } while ((long)uVar14 < rows + -7);
  }
  if ((long)uVar14 < rows + -3) {
    pdVar3 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    pdVar8 = pdVar13 + uVar14 * lVar2;
    pdVar10 = pdVar13 + (uVar14 + 1) * lVar2;
    pdVar6 = pdVar13 + (uVar14 + 2) * lVar2;
    pdVar11 = pdVar13 + (uVar14 + 3) * lVar2;
    do {
      if (cols < 2) {
        dVar19 = 0.0;
        dVar24 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar20 = 0.0;
        dVar26 = 0.0;
        dVar17 = 0.0;
        dVar18 = 0.0;
        lVar12 = 0;
      }
      else {
        dVar17 = 0.0;
        dVar18 = 0.0;
        dVar20 = 0.0;
        dVar26 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar19 = 0.0;
        dVar24 = 0.0;
        lVar9 = 0;
        do {
          pdVar1 = pdVar3 + lVar9;
          dVar28 = *pdVar1;
          dVar21 = pdVar1[1];
          dVar17 = dVar17 + pdVar8[lVar9] * dVar28;
          dVar18 = dVar18 + (pdVar8 + lVar9)[1] * dVar21;
          dVar20 = dVar20 + pdVar10[lVar9] * dVar28;
          dVar26 = dVar26 + (pdVar10 + lVar9)[1] * dVar21;
          dVar15 = dVar15 + pdVar6[lVar9] * dVar28;
          dVar16 = dVar16 + (pdVar6 + lVar9)[1] * dVar21;
          dVar19 = dVar19 + pdVar11[lVar9] * dVar28;
          dVar24 = dVar24 + (pdVar11 + lVar9)[1] * dVar21;
          lVar12 = lVar9 + 2;
          lVar7 = lVar9 + 4;
          lVar9 = lVar12;
        } while (lVar7 <= cols);
      }
      dVar18 = dVar18 + dVar17;
      dVar26 = dVar26 + dVar20;
      dVar16 = dVar16 + dVar15;
      dVar24 = dVar24 + dVar19;
      if (lVar12 < cols) {
        lVar9 = 0;
        do {
          dVar15 = pdVar3[lVar12 + lVar9];
          dVar18 = dVar18 + pdVar8[lVar12 + lVar9] * dVar15;
          dVar26 = dVar26 + pdVar10[lVar12 + lVar9] * dVar15;
          dVar16 = dVar16 + pdVar6[lVar12 + lVar9] * dVar15;
          dVar24 = dVar24 + pdVar11[lVar12 + lVar9] * dVar15;
          lVar9 = lVar9 + 1;
        } while (cols - lVar12 != lVar9);
      }
      res[uVar14 * resIncr] = alpha * dVar18 + res[uVar14 * resIncr];
      lVar9 = (uVar14 + 1) * resIncr;
      res[lVar9] = dVar26 * alpha + res[lVar9];
      lVar9 = (uVar14 + 2) * resIncr;
      res[lVar9] = alpha * dVar16 + res[lVar9];
      lVar9 = (uVar14 + 3) * resIncr;
      res[lVar9] = dVar24 * alpha + res[lVar9];
      uVar14 = uVar14 + 4;
      pdVar8 = pdVar8 + lVar2 * 4;
      pdVar10 = pdVar10 + lVar2 * 4;
      pdVar6 = pdVar6 + lVar2 * 4;
      pdVar11 = pdVar11 + lVar2 * 4;
    } while ((long)uVar14 < rows + -3);
  }
  if ((long)uVar14 < rows + -1) {
    pdVar6 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    pdVar8 = pdVar13 + uVar14 * lVar2;
    pdVar10 = pdVar13 + (uVar14 + 1) * lVar2;
    do {
      if (cols < 2) {
        dVar15 = 0.0;
        dVar16 = 0.0;
        dVar17 = 0.0;
        dVar24 = 0.0;
        lVar12 = 0;
      }
      else {
        dVar17 = 0.0;
        dVar24 = 0.0;
        dVar15 = 0.0;
        dVar16 = 0.0;
        lVar9 = 0;
        do {
          pdVar11 = pdVar6 + lVar9;
          dVar18 = *pdVar11;
          dVar26 = pdVar11[1];
          dVar15 = dVar15 + pdVar8[lVar9] * dVar18;
          dVar16 = dVar16 + (pdVar8 + lVar9)[1] * dVar26;
          dVar17 = dVar17 + pdVar10[lVar9] * dVar18;
          dVar24 = dVar24 + (pdVar10 + lVar9)[1] * dVar26;
          lVar12 = lVar9 + 2;
          lVar7 = lVar9 + 4;
          lVar9 = lVar12;
        } while (lVar7 <= cols);
      }
      dVar16 = dVar16 + dVar15;
      dVar24 = dVar24 + dVar17;
      if (lVar12 < cols) {
        do {
          dVar15 = pdVar6[lVar12];
          dVar16 = dVar16 + pdVar8[lVar12] * dVar15;
          dVar24 = dVar24 + pdVar10[lVar12] * dVar15;
          lVar12 = lVar12 + 1;
        } while (cols != lVar12);
      }
      res[uVar14 * resIncr] = alpha * dVar16 + res[uVar14 * resIncr];
      lVar9 = (uVar14 + 1) * resIncr;
      res[lVar9] = dVar24 * alpha + res[lVar9];
      uVar14 = uVar14 + 2;
      pdVar8 = pdVar8 + lVar2 * 2;
      pdVar10 = pdVar10 + lVar2 * 2;
    } while ((long)uVar14 < rows + -1);
  }
  if ((long)uVar14 < rows) {
    pdVar8 = (rhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data;
    pdVar13 = pdVar13 + lVar2 * uVar14;
    do {
      dVar16 = 0.0;
      dVar15 = 0.0;
      if (cols < 2) {
        lVar12 = 0;
      }
      else {
        lVar9 = 0;
        do {
          pdVar10 = pdVar8 + lVar9;
          dVar16 = dVar16 + pdVar13[lVar9] * *pdVar10;
          dVar15 = dVar15 + (pdVar13 + lVar9)[1] * pdVar10[1];
          lVar12 = lVar9 + 2;
          lVar7 = lVar9 + 4;
          lVar9 = lVar12;
        } while (lVar7 <= cols);
      }
      dVar15 = dVar15 + dVar16;
      if (lVar12 < cols) {
        do {
          dVar15 = dVar15 + pdVar13[lVar12] * pdVar8[lVar12];
          lVar12 = lVar12 + 1;
        } while (cols != lVar12);
      }
      res[uVar14 * resIncr] = dVar15 * alpha + res[uVar14 * resIncr];
      uVar14 = uVar14 + 1;
      pdVar13 = pdVar13 + lVar2;
    } while (uVar14 != rows);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}